

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  st_ptls_log_event_t *psVar1;
  char hexbuf [129];
  char acStack_a8 [144];
  
  if (tls->ctx->log_event != (ptls_log_event_t *)0x0) {
    ptls_hexdump(acStack_a8,secret.base,secret.len);
    psVar1 = tls->ctx->log_event;
    (*psVar1->cb)(psVar1,tls,type,"%s",acStack_a8);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    if (tls->ctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret.base, secret.len);
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", hexbuf);
    }
}